

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingLinesCase::getRenderTargetSize
          (GeometryShaderRenderingLinesCase *this,uint n_instances,uint *out_width,uint *out_height)

{
  TestError *this_00;
  
  if (*(uint *)&(this->super_GeometryShaderRenderingCase).field_0x304 < 3) {
    *out_width = 0x2d;
    *out_height = n_instances * 0x2d;
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unsupported shader output type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xbdc);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingLinesCase::getRenderTargetSize(unsigned int n_instances, unsigned int* out_width,
														   unsigned int* out_height)
{
	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	case SHADER_OUTPUT_TYPE_POINTS:
	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* For SHADER_OUTPUT_TYPE_POINTS:
		 * An edge size of 45px should be used. Given that each input will generate a 3x3 block,
		 * this should give us a delta of 3px between the "quads".
		 *
		 * For instanced draw calls, use a delta of 3px as well.
		 *
		 * For SHADER_OUTPUT_TYPE_LINE_STRIP:
		 * Each rectangle outline will take a 45x45 block. No vertical delta needs to be used.
		 *
		 * For SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		 * Each combination of 4 triangles makes up a triangles that takes 45x45 area.
		 * No vertical delta needs to be used.
		 */
		*out_width  = 3 /* 'pixel' size */ * 8 + 3 /* Delta size */ * 7;
		*out_height = (3 /* 'pixel' size */ * 8 + 3 /* Delta size */ * 7) * n_instances;

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type");
	}
	} /* switch (m_output_type) */
}